

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t *
container_xor(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  array_container_t *paVar5;
  container_t *result;
  container_t *local_10;
  
  uVar4 = (uint)CONCAT71(in_register_00000031,type1);
  if (uVar4 == 4) {
    uVar4 = (uint)*(byte *)((long)c1 + 8);
    if (*(byte *)((long)c1 + 8) == 4) goto LAB_0010ac56;
    c1 = *c1;
  }
  if (type2 == '\x04') {
    type2 = *(byte *)((long)c2 + 8);
    if (type2 == 4) {
LAB_0010ac56:
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    c2 = *c2;
  }
  local_10 = (container_t *)0x0;
  switch((uint)type2 + (uVar4 & 0xff) * 4) {
  case 5:
    _Var1 = bitset_bitset_container_xor((bitset_container_t *)c1,(bitset_container_t *)c2,&local_10)
    ;
    break;
  case 6:
    paVar5 = (array_container_t *)c1;
    c1 = c2;
    goto LAB_0010ac26;
  case 7:
    paVar5 = (array_container_t *)c1;
    c1 = c2;
    goto LAB_0010ac3b;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x162d,
                  "container_t *container_xor(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    paVar5 = (array_container_t *)c2;
LAB_0010ac26:
    _Var1 = array_bitset_container_xor
                      ((array_container_t *)c1,(bitset_container_t *)paVar5,&local_10);
    break;
  case 10:
    _Var1 = array_array_container_xor((array_container_t *)c1,(array_container_t *)c2,&local_10);
    break;
  case 0xb:
    paVar5 = (array_container_t *)c2;
    c2 = c1;
    goto LAB_0010ac04;
  case 0xd:
    paVar5 = (array_container_t *)c2;
LAB_0010ac3b:
    _Var1 = run_bitset_container_xor((run_container_t *)c1,(bitset_container_t *)paVar5,&local_10);
    break;
  case 0xe:
    paVar5 = (array_container_t *)c1;
LAB_0010ac04:
    iVar3 = array_run_container_xor((array_container_t *)c2,(run_container_t *)paVar5,&local_10);
    uVar2 = (uint8_t)iVar3;
    goto LAB_0010ac49;
  case 0xf:
    iVar3 = run_run_container_xor((run_container_t *)c1,(run_container_t *)c2,&local_10);
    uVar2 = (uint8_t)iVar3;
    goto LAB_0010ac49;
  }
  uVar2 = '\x02' - _Var1;
LAB_0010ac49:
  *result_type = uVar2;
  return local_10;
}

Assistant:

static inline container_t* container_xor(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            *result_type = bitset_bitset_container_xor(
                                const_CAST_bitset(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_xor(
                                const_CAST_array(c1),
                                const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            *result_type =
                run_run_container_xor(const_CAST_run(c1),
                                      const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            *result_type = array_bitset_container_xor(
                                const_CAST_array(c2),
                                const_CAST_bitset(c1), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            *result_type = array_bitset_container_xor(
                                const_CAST_array(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            *result_type = run_bitset_container_xor(
                                const_CAST_run(c2),
                                const_CAST_bitset(c1), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            *result_type = run_bitset_container_xor(
                                const_CAST_run(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            *result_type =
                array_run_container_xor(const_CAST_array(c1),
                                        const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            *result_type =
                array_run_container_xor(const_CAST_array(c2),
                                        const_CAST_run(c1), &result);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;  // unreached
    }
}